

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::BeginElemExpr
          (BinaryReaderIR *this,Index elem_index,Index expr_index)

{
  pointer ppEVar1;
  ElemSegment *pEVar2;
  Result RVar3;
  
  ppEVar1 = (this->module_->elem_segments).
            super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (((long)(this->module_->elem_segments).
             super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
             super__Vector_impl_data._M_finish - (long)ppEVar1 >> 3) - 1U != (ulong)elem_index) {
    __assert_fail("elem_index == module_->elem_segments.size() - 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/binary-reader-ir.cc"
                  ,0x59b,
                  "virtual Result wabt::(anonymous namespace)::BinaryReaderIR::BeginElemExpr(Index, Index)"
                 );
  }
  pEVar2 = ppEVar1[elem_index];
  if (((long)*(pointer *)
              ((long)&(pEVar2->elem_exprs).
                      super__Vector_base<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
                      ._M_impl + 8) -
      *(long *)&(pEVar2->elem_exprs).
                super__Vector_base<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
                ._M_impl.super__Vector_impl_data) / 0x18 == (ulong)expr_index) {
    std::
    vector<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>::
    emplace_back<>(&pEVar2->elem_exprs);
    RVar3 = BeginInitExpr(this,*(pointer *)
                                ((long)&(pEVar2->elem_exprs).
                                        super__Vector_base<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
                                        ._M_impl + 8) + -1);
    return (Result)RVar3.enum_;
  }
  __assert_fail("expr_index == segment->elem_exprs.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/binary-reader-ir.cc"
                ,0x59d,
                "virtual Result wabt::(anonymous namespace)::BinaryReaderIR::BeginElemExpr(Index, Index)"
               );
}

Assistant:

Result BinaryReaderIR::BeginElemExpr(Index elem_index, Index expr_index) {
  assert(elem_index == module_->elem_segments.size() - 1);
  ElemSegment* segment = module_->elem_segments[elem_index];
  assert(expr_index == segment->elem_exprs.size());
  segment->elem_exprs.emplace_back();
  return BeginInitExpr(&segment->elem_exprs.back());
}